

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall
Chainstate::ActivateBestChain
          (Chainstate *this,BlockValidationState *state,shared_ptr<const_CBlock> pblock)

{
  ValidationSignals *pVVar1;
  pointer ppCVar2;
  CBlockHeader *this_00;
  pointer pPVar3;
  Notifications *pNVar4;
  string_view source_file;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  ChainstateRole role;
  int iVar9;
  Logger *pLVar10;
  CBlockIndex *this_01;
  CBlockIndex *pCVar11;
  vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_> *pvVar12;
  CBlockIndex *pCVar13;
  Chainstate *pCVar14;
  ChainstateManager *pCVar15;
  CBlockIndex **ppCVar16;
  element_type *pblock_00;
  RecursiveMutex *pmutexIn;
  ulong uVar17;
  pointer pPVar18;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view str;
  undefined4 local_13c;
  shared_ptr<const_CBlock> nullBlockPtr;
  bool fInvalidFound;
  CBlockIndex *pindexNewTip;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock21;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock23;
  ConnectTrace connectTrace;
  string local_78;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock22;
  undefined1 local_48;
  undefined8 local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock21,&this->m_chainstate_mutex,"m_chainstate_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
             ,0xd7d,false);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock22,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
             ,0xd81,false);
  bVar5 = this->m_disabled;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock22.super_unique_lock);
  if (bVar5 == true) {
    pLVar10 = LogInstance();
    bVar5 = BCLog::Logger::Enabled(pLVar10);
    if (bVar5) {
      criticalblock22.super_unique_lock._M_device = (mutex_type *)&stack0xffffffffffffffb8;
      criticalblock22.super_unique_lock._M_owns = false;
      criticalblock22.super_unique_lock._9_7_ = 0;
      local_48 = '\0';
      tinyformat::format<char[42]>
                (&local_78,
                 "m_disabled is set - this chainstate should not be in operation. Please report this as a bug. %s\n"
                 ,(char (*) [42])"https://github.com/bitcoin/bitcoin/issues");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &criticalblock22,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      pLVar10 = LogInstance();
      local_78._M_dataplus._M_p = (pointer)0x57;
      local_78._M_string_length = 0x6d76f9;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x57;
      logging_function._M_str = "ActivateBestChain";
      logging_function._M_len = 0x11;
      str._M_str = (char *)criticalblock22.super_unique_lock._M_device;
      str._M_len = criticalblock22.super_unique_lock._8_8_;
      BCLog::Logger::LogPrintStr(pLVar10,str,logging_function,source_file,0xd83,ALL,Info);
      std::__cxx11::string::~string((string *)&criticalblock22);
    }
    local_13c._0_1_ = 0;
  }
  else {
    pindexNewTip = (CBlockIndex *)0x0;
    bVar5 = false;
    this_01 = (CBlockIndex *)0x0;
    local_13c = SUB84(&this->m_chain,0);
    do {
      pVVar1 = (this->m_chainman->m_options).signals;
      if (pVVar1 != (ValidationSignals *)0x0) {
        LimitValidationInterfaceQueue(pVVar1);
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                (&criticalblock23,&cs_main,"cs_main",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                 ,0xd94,false);
      pmutexIn = &this->m_mempool->cs;
      if (this->m_mempool == (CTxMemPool *)0x0) {
        pmutexIn = (RecursiveMutex *)0x0;
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                (&criticalblock24,pmutexIn,"MempoolMutex()",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                 ,0xd97,false);
      bVar6 = ChainstateManager::IsInitialBlockDownload(this->m_chainman);
      ppCVar2 = (this->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar2 ==
          (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        pCVar13 = (CBlockIndex *)0x0;
      }
      else {
        pCVar13 = ppCVar2[-1];
      }
      bVar7 = false;
LAB_00367462:
      do {
        ConnectTrace::ConnectTrace(&connectTrace);
        if ((this_01 == (CBlockIndex *)0x0) &&
           (this_01 = FindMostWorkChain(this), this_01 == (CBlockIndex *)0x0)) {
          this_01 = (CBlockIndex *)0x0;
LAB_0036763b:
          std::vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_>::~vector
                    (&connectTrace.blocksConnected);
          if (!bVar7) {
            local_13c = 1;
            bVar6 = false;
            goto LAB_00367700;
          }
          break;
        }
        ppCVar2 = (this->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppCVar2 ==
            (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pCVar11 = (CBlockIndex *)0x0;
        }
        else {
          pCVar11 = ppCVar2[-1];
        }
        if (this_01 == pCVar11) goto LAB_0036763b;
        fInvalidFound = false;
        nullBlockPtr.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        nullBlockPtr.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = *(CBlockHeader **)
                   &(pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_CBlockHeader;
        if (this_00 == (CBlockHeader *)0x0) {
LAB_003674e7:
          pblock_00 = (element_type *)&nullBlockPtr;
        }
        else {
          CBlockHeader::GetHash((uint256 *)&criticalblock22.super_unique_lock,this_00);
          CBlockIndex::GetBlockHash((uint256 *)&local_78,this_01);
          bVar7 = ::operator==((base_blob<256U> *)&criticalblock22.super_unique_lock,
                               (base_blob<256U> *)&local_78);
          pblock_00 = pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (!bVar7) goto LAB_003674e7;
        }
        bVar7 = ActivateBestChainStep
                          (this,state,this_01,(shared_ptr<const_CBlock> *)pblock_00,&fInvalidFound,
                           &connectTrace);
        if (!bVar7) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&nullBlockPtr.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_>::~vector
                    (&connectTrace.blocksConnected);
          bVar6 = false;
          bVar7 = false;
          local_13c = 0;
          goto LAB_00367702;
        }
        if (fInvalidFound != false) {
          this_01 = (CBlockIndex *)0x0;
        }
        ppCVar2 = (this->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pindexNewTip = (CBlockIndex *)0x0;
        if (ppCVar2 !=
            (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pindexNewTip = ppCVar2[-1];
        }
        pvVar12 = ConnectTrace::GetBlocksConnected(&connectTrace);
        pPVar3 = (pvVar12->
                 super__Vector_base<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pPVar18 = (pvVar12->
                       super__Vector_base<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_>
                       )._M_impl.super__Vector_impl_data._M_start; pPVar18 != pPVar3;
            pPVar18 = pPVar18 + 1) {
          if (((pPVar18->pblock).super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               == (element_type *)0x0) || (pPVar18->pindex == (CBlockIndex *)0x0)) {
            __assert_fail("trace.pblock && trace.pindex",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0xdb8,
                          "bool Chainstate::ActivateBestChain(BlockValidationState &, std::shared_ptr<const CBlock>)"
                         );
          }
          pVVar1 = (this->m_chainman->m_options).signals;
          if (pVVar1 != (ValidationSignals *)0x0) {
            role = GetRole(this);
            ValidationSignals::BlockConnected(pVVar1,role,&pPVar18->pblock,pPVar18->pindex);
          }
        }
        bVar7 = this->m_disabled;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&nullBlockPtr.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_>::~vector
                  (&connectTrace.blocksConnected);
        if (bVar7 != false) break;
        ppCVar2 = (this->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if ((ppCVar2 ==
             (this->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start) ||
           (pCVar11 = ppCVar2[-1], pCVar11 == (CBlockIndex *)0x0)) {
          bVar7 = true;
          goto LAB_00367462;
        }
        if (pCVar13 == (CBlockIndex *)0x0) break;
        bVar8 = ::node::CBlockIndexWorkComparator::operator()
                          ((CBlockIndexWorkComparator *)&criticalblock22.super_unique_lock,pCVar11,
                           pCVar13);
        bVar7 = true;
      } while (bVar8);
      pCVar13 = CChain::FindFork(&this->m_chain,pCVar13);
      bVar7 = ChainstateManager::IsInitialBlockDownload(this->m_chainman);
      pCVar14 = ChainstateManager::ActiveChainstate(this->m_chainman);
      bVar5 = (bool)((bVar6 && !bVar7) | bVar5);
      if ((pCVar14 == this) && (pCVar13 != pindexNewTip)) {
        pCVar15 = this->m_chainman;
        pVVar1 = (pCVar15->m_options).signals;
        if (pVVar1 != (ValidationSignals *)0x0) {
          ValidationSignals::UpdatedBlockTip(pVVar1,pindexNewTip,pCVar13,bVar7);
          pCVar15 = this->m_chainman;
        }
        pNVar4 = (pCVar15->m_options).notifications;
        uVar17 = (ulong)((pCVar15->m_blockman).m_blockfiles_indexed._M_base._M_i & 1);
        if (!bVar7) {
          uVar17 = 2;
        }
        iVar9 = (*pNVar4->_vptr_Notifications[2])(pNVar4,uVar17,pindexNewTip);
        if (((ushort)iVar9 & 0xff00) != 0x100) goto LAB_00367688;
        bVar7 = true;
        bVar6 = false;
      }
      else {
LAB_00367688:
        bVar6 = true;
LAB_00367700:
        bVar7 = false;
      }
LAB_00367702:
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock24.super_unique_lock);
      if (!bVar6) {
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock23.super_unique_lock);
        if (!bVar7) goto LAB_0036787a;
        break;
      }
      if (((this->m_chainman->m_options).signals != (ValidationSignals *)0x0) &&
         (pCVar14 = ChainstateManager::ActiveChainstate(this->m_chainman), pCVar14 == this)) {
        pVVar1 = (this->m_chainman->m_options).signals;
        ppCVar16 = inline_assertion_check<true,CBlockIndex*&>
                             (&pindexNewTip,
                              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                              ,0xde5,"ActivateBestChain","pindexNewTip");
        pCVar13 = *ppCVar16;
        bVar6 = ChainstateManager::IsInitialBlockDownload(this->m_chainman);
        ValidationSignals::ActiveTipChange(pVVar1,pCVar13,bVar6);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock23.super_unique_lock);
      if (bVar5) {
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                   &criticalblock22.super_unique_lock,&cs_main,"::cs_main",
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                   ,0xded,false);
        ChainstateManager::MaybeRebalanceCaches(this->m_chainman);
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock22.super_unique_lock);
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 &criticalblock22.super_unique_lock,&cs_main,"::cs_main",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                 ,0xdf1,false);
      bVar6 = this->m_disabled;
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock22.super_unique_lock);
      pCVar15 = this->m_chainman;
      if (bVar6 == true) {
        if ((pCVar15->restart_indexes).super__Function_base._M_manager != (_Manager_type)0x0) {
          std::function<void_()>::operator()(&pCVar15->restart_indexes);
        }
        break;
      }
      bVar6 = util::SignalInterrupt::operator_cast_to_bool(pCVar15->m_interrupt);
    } while (!bVar6 && pindexNewTip != this_01);
    ChainstateManager::CheckBlockIndex(this->m_chainman);
    local_13c._0_1_ = FlushStateToDisk(this,state,PERIODIC,0);
  }
LAB_0036787a:
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock21.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)((byte)local_13c & 1);
}

Assistant:

bool Chainstate::ActivateBestChain(BlockValidationState& state, std::shared_ptr<const CBlock> pblock)
{
    AssertLockNotHeld(m_chainstate_mutex);

    // Note that while we're often called here from ProcessNewBlock, this is
    // far from a guarantee. Things in the P2P/RPC will often end up calling
    // us in the middle of ProcessNewBlock - do not assume pblock is set
    // sanely for performance or correctness!
    AssertLockNotHeld(::cs_main);

    // ABC maintains a fair degree of expensive-to-calculate internal state
    // because this function periodically releases cs_main so that it does not lock up other threads for too long
    // during large connects - and to allow for e.g. the callback queue to drain
    // we use m_chainstate_mutex to enforce mutual exclusion so that only one caller may execute this function at a time
    LOCK(m_chainstate_mutex);

    // Belt-and-suspenders check that we aren't attempting to advance the background
    // chainstate past the snapshot base block.
    if (WITH_LOCK(::cs_main, return m_disabled)) {
        LogPrintf("m_disabled is set - this chainstate should not be in operation. "
            "Please report this as a bug. %s\n", PACKAGE_BUGREPORT);
        return false;
    }

    CBlockIndex *pindexMostWork = nullptr;
    CBlockIndex *pindexNewTip = nullptr;
    bool exited_ibd{false};
    do {
        // Block until the validation queue drains. This should largely
        // never happen in normal operation, however may happen during
        // reindex, causing memory blowup if we run too far ahead.
        // Note that if a validationinterface callback ends up calling
        // ActivateBestChain this may lead to a deadlock! We should
        // probably have a DEBUG_LOCKORDER test for this in the future.
        if (m_chainman.m_options.signals) LimitValidationInterfaceQueue(*m_chainman.m_options.signals);

        {
            LOCK(cs_main);
            {
            // Lock transaction pool for at least as long as it takes for connectTrace to be consumed
            LOCK(MempoolMutex());
            const bool was_in_ibd = m_chainman.IsInitialBlockDownload();
            CBlockIndex* starting_tip = m_chain.Tip();
            bool blocks_connected = false;
            do {
                // We absolutely may not unlock cs_main until we've made forward progress
                // (with the exception of shutdown due to hardware issues, low disk space, etc).
                ConnectTrace connectTrace; // Destructed before cs_main is unlocked

                if (pindexMostWork == nullptr) {
                    pindexMostWork = FindMostWorkChain();
                }

                // Whether we have anything to do at all.
                if (pindexMostWork == nullptr || pindexMostWork == m_chain.Tip()) {
                    break;
                }

                bool fInvalidFound = false;
                std::shared_ptr<const CBlock> nullBlockPtr;
                if (!ActivateBestChainStep(state, pindexMostWork, pblock && pblock->GetHash() == pindexMostWork->GetBlockHash() ? pblock : nullBlockPtr, fInvalidFound, connectTrace)) {
                    // A system error occurred
                    return false;
                }
                blocks_connected = true;

                if (fInvalidFound) {
                    // Wipe cache, we may need another branch now.
                    pindexMostWork = nullptr;
                }
                pindexNewTip = m_chain.Tip();

                for (const PerBlockConnectTrace& trace : connectTrace.GetBlocksConnected()) {
                    assert(trace.pblock && trace.pindex);
                    if (m_chainman.m_options.signals) {
                        m_chainman.m_options.signals->BlockConnected(this->GetRole(), trace.pblock, trace.pindex);
                    }
                }

                // This will have been toggled in
                // ActivateBestChainStep -> ConnectTip -> MaybeCompleteSnapshotValidation,
                // if at all, so we should catch it here.
                //
                // Break this do-while to ensure we don't advance past the base snapshot.
                if (m_disabled) {
                    break;
                }
            } while (!m_chain.Tip() || (starting_tip && CBlockIndexWorkComparator()(m_chain.Tip(), starting_tip)));
            if (!blocks_connected) return true;

            const CBlockIndex* pindexFork = m_chain.FindFork(starting_tip);
            bool still_in_ibd = m_chainman.IsInitialBlockDownload();

            if (was_in_ibd && !still_in_ibd) {
                // Active chainstate has exited IBD.
                exited_ibd = true;
            }

            // Notify external listeners about the new tip.
            // Enqueue while holding cs_main to ensure that UpdatedBlockTip is called in the order in which blocks are connected
            if (this == &m_chainman.ActiveChainstate() && pindexFork != pindexNewTip) {
                // Notify ValidationInterface subscribers
                if (m_chainman.m_options.signals) {
                    m_chainman.m_options.signals->UpdatedBlockTip(pindexNewTip, pindexFork, still_in_ibd);
                }

                // Always notify the UI if a new block tip was connected
                if (kernel::IsInterrupted(m_chainman.GetNotifications().blockTip(GetSynchronizationState(still_in_ibd, m_chainman.m_blockman.m_blockfiles_indexed), *pindexNewTip))) {
                    // Just breaking and returning success for now. This could
                    // be changed to bubble up the kernel::Interrupted value to
                    // the caller so the caller could distinguish between
                    // completed and interrupted operations.
                    break;
                }
            }
            } // release MempoolMutex
            // Notify external listeners about the new tip, even if pindexFork == pindexNewTip.
            if (m_chainman.m_options.signals && this == &m_chainman.ActiveChainstate()) {
                m_chainman.m_options.signals->ActiveTipChange(*Assert(pindexNewTip), m_chainman.IsInitialBlockDownload());
            }
        } // release cs_main
        // When we reach this point, we switched to a new tip (stored in pindexNewTip).

        if (exited_ibd) {
            // If a background chainstate is in use, we may need to rebalance our
            // allocation of caches once a chainstate exits initial block download.
            LOCK(::cs_main);
            m_chainman.MaybeRebalanceCaches();
        }

        if (WITH_LOCK(::cs_main, return m_disabled)) {
            // Background chainstate has reached the snapshot base block, so exit.

            // Restart indexes to resume indexing for all blocks unique to the snapshot
            // chain. This resumes indexing "in order" from where the indexing on the
            // background validation chain left off.
            //
            // This cannot be done while holding cs_main (within
            // MaybeCompleteSnapshotValidation) or a cs_main deadlock will occur.
            if (m_chainman.restart_indexes) {
                m_chainman.restart_indexes();
            }
            break;
        }

        // We check interrupt only after giving ActivateBestChainStep a chance to run once so that we
        // never interrupt before connecting the genesis block during LoadChainTip(). Previously this
        // caused an assert() failure during interrupt in such cases as the UTXO DB flushing checks
        // that the best block hash is non-null.
        if (m_chainman.m_interrupt) break;
    } while (pindexNewTip != pindexMostWork);

    m_chainman.CheckBlockIndex();

    // Write changes periodically to disk, after relay.
    if (!FlushStateToDisk(state, FlushStateMode::PERIODIC)) {
        return false;
    }

    return true;
}